

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

bool __thiscall QToolBarAreaLayout::toolBarBreak(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  int iVar1;
  qsizetype qVar2;
  const_reference pQVar3;
  const_reference pQVar4;
  undefined4 extraout_var;
  long in_RSI;
  long in_RDI;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  qsizetype in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int local_3c;
  int local_2c;
  int local_1c;
  
  local_1c = 0;
  do {
    if (3 < local_1c) {
      return false;
    }
    for (local_2c = 0;
        qVar2 = QList<QToolBarAreaLayoutLine>::size
                          ((QList<QToolBarAreaLayoutLine> *)(in_RDI + 0x18 + (long)local_1c * 0x38))
        , local_2c < qVar2; local_2c = local_2c + 1) {
      pQVar3 = QList<QToolBarAreaLayoutLine>::at
                         ((QList<QToolBarAreaLayoutLine> *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
      for (local_3c = 0; qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems),
          local_3c < qVar2; local_3c = local_3c + 1) {
        pQVar4 = QList<QToolBarAreaLayoutItem>::at
                           ((QList<QToolBarAreaLayoutItem> *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
        iVar1 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])();
        if (CONCAT44(extraout_var,iVar1) == in_RSI) {
          return 0 < local_2c && local_3c == 0;
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool QToolBarAreaLayout::toolBarBreak(QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return j > 0 && k == 0;
            }
        }
    }

    return false;
}